

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageQueue.cpp
# Opt level: O3

void __thiscall
f8n::runtime::MessageQueue::UnregisterForBroadcasts(MessageQueue *this,IMessageTarget *target)

{
  _Rb_tree_header *p_Var1;
  _Atomic_word *p_Var2;
  int iVar3;
  _Base_ptr this_00;
  _Atomic_word _Var4;
  _Base_ptr p_Var5;
  bool bVar6;
  pair<std::_Rb_tree_iterator<std::weak_ptr<f8n::runtime::IMessageTarget>_>,_std::_Rb_tree_iterator<std::weak_ptr<f8n::runtime::IMessageTarget>_>_>
  pVar7;
  weak_ptr<f8n::runtime::IMessageTarget> it;
  LockT lock;
  key_type local_50;
  unique_lock<std::mutex> local_40;
  
  local_40._M_device = &this->queueMutex;
  local_40._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_40);
  local_40._M_owns = true;
  p_Var5 = (this->receivers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->receivers)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var5 != p_Var1) {
    do {
      local_50.super___weak_ptr<f8n::runtime::IMessageTarget,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           *(element_type **)(p_Var5 + 1);
      this_00 = p_Var5[1]._M_parent;
      local_50.super___weak_ptr<f8n::runtime::IMessageTarget,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00;
      if (this_00 != (_Base_ptr)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var2 = (_Atomic_word *)((long)&this_00->_M_parent + 4);
          *p_Var2 = *p_Var2 + 1;
          UNLOCK();
          if (this_00 == (_Base_ptr)0x0) goto LAB_001d1681;
        }
        else {
          p_Var2 = (_Atomic_word *)((long)&this_00->_M_parent + 4);
          *p_Var2 = *p_Var2 + 1;
        }
        _Var4 = *(_Atomic_word *)&this_00->_M_parent;
        do {
          if (_Var4 == 0) goto LAB_001d1650;
          LOCK();
          iVar3 = *(int *)&this_00->_M_parent;
          bVar6 = _Var4 == iVar3;
          if (bVar6) {
            *(_Atomic_word *)&this_00->_M_parent = _Var4 + 1;
            iVar3 = _Var4;
          }
          _Var4 = iVar3;
          UNLOCK();
        } while (!bVar6);
        if (((*(int *)&this_00->_M_parent != 0) &&
            (local_50.super___weak_ptr<f8n::runtime::IMessageTarget,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr != (IMessageTarget *)0x0)) &&
           (local_50.super___weak_ptr<f8n::runtime::IMessageTarget,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr == target)) {
          pVar7 = std::
                  _Rb_tree<std::weak_ptr<f8n::runtime::IMessageTarget>,_std::weak_ptr<f8n::runtime::IMessageTarget>,_std::_Identity<std::weak_ptr<f8n::runtime::IMessageTarget>_>,_f8n::runtime::MessageQueue::WeakPtrLess,_std::allocator<std::weak_ptr<f8n::runtime::IMessageTarget>_>_>
                  ::equal_range(&(this->receivers)._M_t,&local_50);
          std::
          _Rb_tree<std::weak_ptr<f8n::runtime::IMessageTarget>,_std::weak_ptr<f8n::runtime::IMessageTarget>,_std::_Identity<std::weak_ptr<f8n::runtime::IMessageTarget>_>,_f8n::runtime::MessageQueue::WeakPtrLess,_std::allocator<std::weak_ptr<f8n::runtime::IMessageTarget>_>_>
          ::_M_erase_aux(&(this->receivers)._M_t,(_Base_ptr)pVar7.first._M_node,
                         (_Base_ptr)pVar7.second._M_node);
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
          if ((_Base_ptr)
              local_50.super___weak_ptr<f8n::runtime::IMessageTarget,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Base_ptr)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var2 = &(local_50.
                         super___weak_ptr<f8n::runtime::IMessageTarget,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi)->_M_weak_count;
              _Var4 = *p_Var2;
              *p_Var2 = *p_Var2 + -1;
              UNLOCK();
            }
            else {
              _Var4 = (local_50.
                       super___weak_ptr<f8n::runtime::IMessageTarget,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi)->_M_weak_count;
              (local_50.super___weak_ptr<f8n::runtime::IMessageTarget,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_weak_count = _Var4 + -1;
            }
            if (_Var4 == 1) {
              (*(local_50.super___weak_ptr<f8n::runtime::IMessageTarget,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi)->_vptr__Sp_counted_base[3])();
            }
          }
          break;
        }
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
LAB_001d1650:
        if ((_Base_ptr)
            local_50.super___weak_ptr<f8n::runtime::IMessageTarget,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Base_ptr)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var2 = &(local_50.
                       super___weak_ptr<f8n::runtime::IMessageTarget,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi)->_M_weak_count;
            _Var4 = *p_Var2;
            *p_Var2 = *p_Var2 + -1;
            UNLOCK();
          }
          else {
            _Var4 = (local_50.
                     super___weak_ptr<f8n::runtime::IMessageTarget,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi)->_M_weak_count;
            (local_50.super___weak_ptr<f8n::runtime::IMessageTarget,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_weak_count = _Var4 + -1;
          }
          if (_Var4 == 1) {
            (*(local_50.super___weak_ptr<f8n::runtime::IMessageTarget,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_vptr__Sp_counted_base[3])();
          }
        }
      }
LAB_001d1681:
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
    } while ((_Rb_tree_header *)p_Var5 != p_Var1);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_40);
  return;
}

Assistant:

void MessageQueue::UnregisterForBroadcasts(IMessageTarget *target) {
    LockT lock(this->queueMutex);
    for (auto it : this->receivers) {
        auto shared = it.lock();
        if (shared && shared.get() == target) {
            this->receivers.erase(it);
            return;
        }
    }
}